

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfInputReadPixels(ImfInputFile *in,int scanLine1,int scanLine2)

{
  ImfInputFile *in_RDI;
  exception *e;
  int in_stack_00000058;
  int in_stack_0000005c;
  RgbaInputFile *in_stack_00000060;
  
  anon_unknown.dwarf_70604::infile(in_RDI);
  Imf_3_4::RgbaInputFile::readPixels(in_stack_00000060,in_stack_0000005c,in_stack_00000058);
  return 1;
}

Assistant:

int
ImfInputReadPixels (ImfInputFile* in, int scanLine1, int scanLine2)
{
    try
    {
        infile (in)->readPixels (scanLine1, scanLine2);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}